

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvstore.cpp
# Opt level: O2

bool __thiscall KVStore::del(KVStore *this,uint64_t key)

{
  string value;
  allocator local_59;
  string local_58;
  string local_38 [8];
  long local_30;
  
  (*(this->super_KVStoreAPI)._vptr_KVStoreAPI[1])(local_38,this,key);
  if (local_30 != 0) {
    SkipList::remove(&this->memTable,(char *)key);
    std::__cxx11::string::string((string *)&local_58,"~DELETED~",&local_59);
    SkipList::put(&this->memTable,key,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::~string(local_38);
  return local_30 != 0;
}

Assistant:

bool KVStore::del(uint64_t key) {
  auto value = get(key);
  if (value.empty()) return false;
  memTable.remove(key);
  memTable.put(key, "~DELETED~");
  return true;
}